

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask16_16(uint32_t *in,uint32_t *out)

{
  long in_RAX;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
  auVar1 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  *(undefined1 (*) [32])out = auVar1;
  vpmovsxbd_avx2(ZEXT816(0x3c342c241c140c04));
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  auVar2 = vpslld_avx2(auVar2,0x10);
  auVar1 = vpor_avx2(auVar2,auVar1);
  *(undefined1 (*) [32])out = auVar1;
  return out + 8;
}

Assistant:

uint32_t *__fastpackwithoutmask16_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}